

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::MethodOptions::MergePartialFromCodedStream
          (MethodOptions *this,CodedInputStream *input)

{
  uint tag_00;
  CodedInputStream *pCVar1;
  bool bVar2;
  int iVar3;
  WireType WVar4;
  pair<unsigned_int,_bool> pVar5;
  UninterpretedOption *value_00;
  MethodOptions *containing_type;
  UnknownFieldSet *pUVar6;
  bool local_8a;
  bool local_89;
  MethodOptions_IdempotencyLevel local_78;
  uint local_74;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  MethodOptions *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x1000036c = input;
LAB_0053011b:
  _first_byte_or_zero = stack0xffffffffffffff98;
  kMax1ByteVarint = 0x3fff;
  tag_2 = 0;
  if (stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) {
    tag_2 = (uint32)*stack0xffffffffffffff98->buffer_;
    if ((char)*stack0xffffffffffffff98->buffer_ < '\x01') {
      if ((stack0xffffffffffffff98->buffer_end_ <= stack0xffffffffffffff98->buffer_ + 1) ||
         ((*stack0xffffffffffffff98->buffer_ & (stack0xffffffffffffff98->buffer_[1] ^ 0xff)) < 0x80)
         ) goto LAB_0053029a;
      uStack_30 = 0x3fff;
      tag_1 = (uint)stack0xffffffffffffff98->buffer_[1] * 0x80 +
              (*stack0xffffffffffffff98->buffer_ - 0x80);
      io::CodedInputStream::Advance(stack0xffffffffffffff98,2);
      local_8a = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
      local_35 = local_8a;
      pVar5 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
      local_10 = pVar5.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
    }
    else {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
      io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar5 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar5.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
    }
  }
  else {
LAB_0053029a:
    local_3c = io::CodedInputStream::ReadTagFallback(stack0xffffffffffffff98,tag_2);
    local_3d = local_3c - 1 < kMax1ByteVarint;
    pVar5 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
    local_10 = pVar5.first;
    uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
  }
  value._0_1_ = (undefined1)uStack_c;
  local_74 = local_10;
  p.first = local_74;
  if ((uStack_c & 1) != 0) {
    iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_10);
    pCVar1 = stack0xffffffffffffff98;
    if (iVar3 == 0x21) {
      if ((p.first & 0xff) != 8) goto LAB_00530423;
      set_has_deprecated(this);
      bVar2 = internal::WireFormatLite::
              ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                        (stack0xffffffffffffff98,&this->deprecated_);
      goto joined_r0x005304e7;
    }
    if (iVar3 == 0x22) {
      if ((p.first & 0xff) != 0x10) goto LAB_00530423;
      bVar2 = internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (stack0xffffffffffffff98,(int *)&local_78);
      if (!bVar2) {
        return false;
      }
      bVar2 = MethodOptions_IdempotencyLevel_IsValid(local_78);
      if (bVar2) {
        set_idempotency_level(this,local_78);
      }
      else {
        pUVar6 = mutable_unknown_fields(this);
        UnknownFieldSet::AddVarint(pUVar6,0x22,(long)(int)local_78);
      }
      goto LAB_0053011b;
    }
    if ((iVar3 == 999) && ((p.first & 0xff) == 0x3a)) {
      value_00 = add_uninterpreted_option(this);
      bVar2 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::UninterpretedOption>
                        (pCVar1,value_00);
      goto joined_r0x005304e7;
    }
  }
LAB_00530423:
  if ((p.first == 0) ||
     (WVar4 = internal::WireFormatLite::GetTagWireType(p.first), pCVar1 = stack0xffffffffffffff98,
     tag_00 = p.first, WVar4 == WIRETYPE_END_GROUP)) {
    return true;
  }
  if (p.first < 8000) {
    pUVar6 = mutable_unknown_fields(this);
    bVar2 = internal::WireFormat::SkipField(pCVar1,tag_00,pUVar6);
  }
  else {
    containing_type = internal_default_instance();
    pUVar6 = mutable_unknown_fields(this);
    bVar2 = internal::ExtensionSet::ParseField
                      (&this->_extensions_,tag_00,pCVar1,&containing_type->super_Message,pUVar6);
  }
joined_r0x005304e7:
  if (!bVar2) {
    return false;
  }
  goto LAB_0053011b;
}

Assistant:

bool MethodOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.MethodOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool deprecated = 33 [default = false];
      case 33: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(264u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.MethodOptions.IdempotencyLevel idempotency_level = 34 [default = IDEMPOTENCY_UNKNOWN];
      case 34: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(272u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::MethodOptions_IdempotencyLevel_IsValid(value)) {
            set_idempotency_level(static_cast< ::google::protobuf::MethodOptions_IdempotencyLevel >(value));
          } else {
            mutable_unknown_fields()->AddVarint(34, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.MethodOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.MethodOptions)
  return false;
#undef DO_
}